

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_mod_2d(mp_int *a,int b,mp_int *c)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  if (b < 1) {
    mp_zero(c);
  }
  else {
    iVar1 = a->used;
    iVar4 = mp_copy(a,c);
    if (iVar4 != 0 || iVar1 * 0x3c <= b) {
      return iVar4;
    }
    uVar2 = (ulong)(uint)b / 0x3c;
    uVar3 = (ulong)(uint)b % 0x3c;
    iVar1 = c->used;
    for (uVar5 = (ulong)(((int)uVar2 + 1) - (uint)((int)uVar3 == 0)); (long)uVar5 < (long)iVar1;
        uVar5 = uVar5 + 1) {
      c->dp[uVar5] = 0;
    }
    c->dp[uVar2] = c->dp[uVar2] & ~(-1L << (sbyte)uVar3);
    mp_clamp(c);
  }
  return 0;
}

Assistant:

int mp_mod_2d (mp_int * a, int b, mp_int * c)
{
  int     x, res;

  /* if b is <= 0 then zero the int */
  if (b <= 0) {
    mp_zero (c);
    return MP_OKAY;
  }

  /* if the modulus is larger than the value than return */
  if (b >= (int) (a->used * DIGIT_BIT)) {
    res = mp_copy (a, c);
    return res;
  }

  /* copy */
  if ((res = mp_copy (a, c)) != MP_OKAY) {
    return res;
  }

  /* zero digits above the last digit of the modulus */
  for (x = (b / DIGIT_BIT) + ((b % DIGIT_BIT) == 0 ? 0 : 1); x < c->used; x++) {
    c->dp[x] = 0;
  }
  /* clear the digit that is not completely outside/inside the modulus */
  c->dp[b / DIGIT_BIT] &=
    (mp_digit) ((((mp_digit) 1) << (((mp_digit) b) % DIGIT_BIT)) - ((mp_digit) 1));
  mp_clamp (c);
  return MP_OKAY;
}